

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expint_e1.c
# Opt level: O1

double xc_expint_e1_impl(double x,int scale)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  bVar1 = x < 701.8334146820821 || scale != 0;
  dVar7 = x;
  if (x >= 701.8334146820821 && scale == 0) {
    dVar7 = 701.8334146820821;
  }
  if (dVar7 <= -10.0) {
    dVar3 = 1.0;
    if (scale == 0) {
      dVar3 = exp(-dVar7);
    }
    dVar5 = 20.0 / dVar7 + 1.0;
    uVar2 = 0x28;
    dVar6 = 0.0;
    dVar4 = 0.0;
    do {
      dVar8 = dVar6;
      dVar9 = ((dVar5 + dVar5) * dVar4 - dVar8) + (double)(&DAT_010a83c0)[uVar2];
      uVar2 = uVar2 - 1;
      dVar6 = dVar4;
      dVar4 = dVar9;
    } while (1 < uVar2);
  }
  else if (dVar7 <= -4.0) {
    dVar3 = 1.0;
    if (scale == 0) {
      dVar3 = exp(-dVar7);
    }
    dVar5 = (40.0 / dVar7 + 7.0) / 3.0;
    uVar2 = 0x1a;
    dVar6 = 0.0;
    dVar4 = 0.0;
    do {
      dVar8 = dVar6;
      dVar9 = ((dVar5 + dVar5) * dVar4 - dVar8) + AE11_data[uVar2 + 0x26];
      uVar2 = uVar2 - 1;
      dVar6 = dVar4;
      dVar4 = dVar9;
    } while (1 < uVar2);
  }
  else {
    if (dVar7 <= -1.0) {
      if (scale == 0) {
        dVar3 = 1.0;
      }
      else {
        dVar3 = exp(dVar7);
      }
      if (bVar1) {
        dVar6 = ABS(x);
      }
      else {
        dVar6 = 701.8334146820821;
      }
      dVar4 = log(dVar6);
      dVar5 = (dVar7 + dVar7 + 5.0) / 3.0;
      uVar2 = 0x14;
      dVar7 = 0.0;
      dVar6 = 0.0;
      do {
        dVar8 = dVar6;
        dVar6 = dVar7;
        dVar7 = ((dVar5 + dVar5) * dVar6 - dVar8) + AE12_data[uVar2 + 0x18];
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
      return dVar3 * ((dVar7 - dVar8) * 0.5 - dVar4);
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      xc_expint_e1_impl_cold_1();
      return 0.0;
    }
    dVar3 = 1.0;
    if (dVar7 <= 1.0) {
      if (scale != 0) {
        dVar3 = exp(dVar7);
      }
      if (bVar1) {
        dVar6 = ABS(x);
      }
      else {
        dVar6 = 701.8334146820821;
      }
      dVar5 = log(dVar6);
      uVar2 = 0x11;
      dVar6 = 0.0;
      dVar4 = 0.0;
      do {
        dVar8 = dVar4;
        dVar4 = dVar6;
        dVar6 = ((dVar7 + dVar7) * dVar4 - dVar8) + E11_data[uVar2 + 0x12];
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
      return dVar3 * ((dVar6 - dVar8) * 0.5 + dVar7 + (-0.6875 - dVar5));
    }
    if (dVar7 <= 4.0) {
      dVar3 = 1.0;
      if (scale == 0) {
        dVar3 = exp(-dVar7);
      }
      dVar5 = (8.0 / dVar7 + -5.0) / 3.0;
      uVar2 = 0x1a;
      dVar6 = 0.0;
      dVar4 = 0.0;
      do {
        dVar8 = dVar6;
        dVar9 = ((dVar5 + dVar5) * dVar4 - dVar8) + E12_data[uVar2 + 0xe];
        uVar2 = uVar2 - 1;
        dVar6 = dVar4;
        dVar4 = dVar9;
      } while (1 < uVar2);
    }
    else {
      if ((scale == 0) && (701.8334146820821 < dVar7)) {
        fprintf(_stderr,"Argument %14.10le is larger than xmax=%14.10le in expint_e1\n",dVar7,
                0x4085eeaad5511c64);
        return 0.0;
      }
      dVar3 = 1.0;
      if (scale == 0) {
        dVar3 = exp(-dVar7);
      }
      dVar5 = 8.0 / dVar7 + -1.0;
      uVar2 = 0x1b;
      dVar6 = 0.0;
      dVar4 = 0.0;
      do {
        dVar8 = dVar6;
        dVar9 = ((dVar5 + dVar5) * dVar4 - dVar8) + AE13_data[uVar2 + 0x18];
        uVar2 = uVar2 - 1;
        dVar6 = dVar4;
        dVar4 = dVar9;
      } while (1 < uVar2);
    }
  }
  return ((dVar9 - dVar8) * 0.5 + 1.0) * (1.0 / dVar7) * dVar3;
}

Assistant:

GPU_FUNCTION double xc_expint_e1_impl(double x, const int scale){
  const double xmaxt = -LOG_DBL_MIN;        /* XMAXT = -log (R1MACH(1)) */
  const double xmax  = xmaxt - log(xmaxt);    /* XMAX = XMAXT - log(XMAXT) */

  double e1 = 0.0;

  /* this is a workaround not to have argument errors */
  if(! scale) x = m_min(x, xmax);

  if(x <= -10.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval(20.0/x + 1.0, AE11_data, 39));
  }else if(x <= -4.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval((40.0/x + 7.0)/3.0, AE12_data, 25));
  }else if(x <= -1.0){
    const double scale_factor = ( scale ? exp(x) : 1.0 );
    e1 = scale_factor * (-log(fabs(x)) + xc_cheb_eval((2.0*x + 5.0)/3.0, E11_data, 19));
  }else if(x == 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Argument cannot be 0.0 in expint_e1\n");
#endif
  }else if(x <= 1.0){
    const double scale_factor = ( scale ? exp(x) : 1.0 );
    e1 = scale_factor*(-log(fabs(x)) - 0.6875 + x + xc_cheb_eval(x, E12_data, 16));
  }else if(x <= 4.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval((8.0/x - 5.0)/3.0, AE13_data, 25));
  }else if(x <= xmax || scale){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval(8.0/x - 1.0, AE14_data, 26));
  }else{
#ifndef HAVE_CUDA
  fprintf(stderr, "Argument %14.10le is larger than xmax=%14.10le in expint_e1\n", x, xmax);
#endif
  }

  return e1;
}